

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O0

ExactFloat * __thiscall ExactFloat::operator=(ExactFloat *this,ExactFloat *b)

{
  BIGNUM *a;
  BIGNUM *b_00;
  ExactFloat *b_local;
  ExactFloat *this_local;
  
  if (this != b) {
    this->sign_ = b->sign_;
    this->bn_exp_ = b->bn_exp_;
    a = (BIGNUM *)BigNum::get(&this->bn_);
    b_00 = (BIGNUM *)BigNum::get(&b->bn_);
    BN_copy(a,b_00);
  }
  return this;
}

Assistant:

ExactFloat& ExactFloat::operator=(const ExactFloat& b) {
  if (this != &b) {
    sign_ = b.sign_;
    bn_exp_ = b.bn_exp_;
    BN_copy(bn_.get(), b.bn_.get());
  }
  return *this;
}